

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QString * maybeEncodeTag(QCborContainerPrivate *d)

{
  long lVar1;
  QByteArrayView bytes;
  Element e_00;
  const_reference pEVar2;
  anon_union_8_2_4ee71171_for_Element_0 d_00;
  ByteData *pBVar3;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  ByteData *b;
  Element *e;
  qint64 tag;
  qsizetype in_stack_ffffffffffffff48;
  QList<QtCbor::Element> *in_stack_ffffffffffffff50;
  QByteArray *ba;
  undefined4 uVar4;
  StringFormat mode;
  QUuid *this;
  QCborContainerPrivate *in_stack_ffffffffffffff78;
  QCborTag in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QByteArrayView *pQVar5;
  Data *in_stack_ffffffffffffffb0;
  QCborContainerPrivate *in_stack_ffffffffffffffb8;
  ConversionMode mode_00;
  
  uVar4 = SUB84(in_RDI,0);
  mode = (StringFormat)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  pEVar2 = QList<QtCbor::Element>::at(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  mode_00 = (ConversionMode)((ulong)pQVar5 >> 0x20);
  this = (QUuid *)(pEVar2->field_0).value;
  d_00.container =
       (QCborContainerPrivate *)
       QList<QtCbor::Element>::at(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  switch(this) {
  case (QUuid *)0x0:
  case (QUuid *)0x20:
    if ((int)(d_00.container)->usedData == 0x60) {
      makeString(in_stack_ffffffffffffffb8,(qsizetype)in_stack_ffffffffffffffb0,mode_00);
      goto LAB_0048cc42;
    }
    break;
  case (QUuid *)0x15:
  case (QUuid *)0x16:
  case (QUuid *)0x17:
    if ((int)(d_00.container)->usedData == 0x40) {
      encodeByteArray(d_00.container,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      goto LAB_0048cc42;
    }
    break;
  case (QUuid *)0x25:
    e_00._8_8_ = this;
    e_00.field_0.container = (QCborContainerPrivate *)d_00.value;
    pBVar3 = QCborContainerPrivate::byteData(in_stack_ffffffffffffff78,e_00);
    if ((((int)(d_00.container)->usedData == 0x40) && (pBVar3 != (ByteData *)0x0)) &&
       (pBVar3->len == 0x10)) {
      ba = (QByteArray *)&stack0xffffffffffffffb0;
      QtCbor::ByteData::asByteArrayView((ByteData *)ba);
      QByteArrayView::QByteArrayView<QByteArray,_true>(in_RDI,ba);
      bytes.m_data._0_4_ = uVar4;
      bytes.m_size = (qsizetype)in_RDI;
      bytes.m_data._4_4_ = mode;
      QUuid::fromRfc4122(bytes);
      QUuid::toString(this,mode);
      QByteArray::~QByteArray((QByteArray *)0x48cc16);
      goto LAB_0048cc42;
    }
  }
  QString::QString((QString *)0x48cc42);
LAB_0048cc42:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)CONCAT44(mode,uVar4);
  }
  __stack_chk_fail();
}

Assistant:

static QString maybeEncodeTag(const QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    const Element &e = d->elements.at(1);

    switch (tag) {
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String)
            return makeString(d, 1);
        break;

    case qint64(QCborKnownTags::ExpectedBase64url):
    case qint64(QCborKnownTags::ExpectedBase64):
    case qint64(QCborKnownTags::ExpectedBase16):
        if (e.type == QCborValue::ByteArray)
            return encodeByteArray(d, 1, QCborTag(tag));
        break;

    case qint64(QCborKnownTags::Uuid):
#ifndef QT_BOOTSTRAPPED
        if (const ByteData *b = d->byteData(e); e.type == QCborValue::ByteArray && b
                && b->len == sizeof(QUuid))
            return QUuid::fromRfc4122(b->asByteArrayView()).toString(QUuid::WithoutBraces);
#endif
        break;
    }

    // don't know what to do, bail out
    return QString();
}